

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPrT.cpp
# Opt level: O1

void __thiscall OpenMD::NPrT::scaleSimBox(NPrT *this)

{
  double dVar1;
  undefined8 uVar2;
  double *pdVar3;
  uint j;
  long lVar4;
  double *pdVar5;
  uint k;
  long lVar6;
  uint i;
  long lVar7;
  double (*__return_storage_ptr__) [3];
  SquareMatrix3<double> result;
  Mat3x3d scaleMat;
  Mat3x3d hmat;
  double local_108 [10];
  double local_b8 [10];
  Mat3x3d local_68;
  
  local_b8[6] = 0.0;
  local_b8[7] = 0.0;
  local_b8[4] = 0.0;
  local_b8[5] = 0.0;
  local_b8[2] = 0.0;
  local_b8[3] = 0.0;
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  lVar7 = 0;
  local_b8[8] = 0.0;
  dVar1 = exp((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt *
              *(double *)
               ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_ + (ulong)this->axis1_ * 0x20));
  local_b8[(ulong)this->axis1_ * 4] = dVar1;
  dVar1 = exp((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt *
              *(double *)
               ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_ + (ulong)this->axis2_ * 0x20));
  local_b8[(ulong)this->axis2_ * 4] = dVar1;
  dVar1 = exp((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt *
              *(double *)
               ((long)(this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_ + (ulong)this->axis_ * 0x20));
  local_b8[(ulong)this->axis_ * 4] = dVar1;
  __return_storage_ptr__ = (double (*) [3])&local_68;
  Snapshot::getHmat((Mat3x3d *)__return_storage_ptr__,
                    (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap);
  local_108[8] = 0.0;
  local_108[6] = 0.0;
  local_108[7] = 0.0;
  local_108[4] = 0.0;
  local_108[5] = 0.0;
  local_108[2] = 0.0;
  local_108[3] = 0.0;
  local_108[0] = 0.0;
  local_108[1] = 0.0;
  do {
    lVar4 = 0;
    pdVar3 = local_b8;
    do {
      dVar1 = local_108[lVar7 * 3 + lVar4];
      lVar6 = 0;
      pdVar5 = pdVar3;
      do {
        dVar1 = dVar1 + (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                        super_RectMatrix<double,_3U,_3U>).data_[0][lVar6] * *pdVar5;
        lVar6 = lVar6 + 1;
        pdVar5 = pdVar5 + 3;
      } while (lVar6 != 3);
      local_108[lVar7 * 3 + lVar4] = dVar1;
      lVar4 = lVar4 + 1;
      pdVar3 = pdVar3 + 1;
    } while (lVar4 != 3);
    lVar7 = lVar7 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
  } while (lVar7 != 3);
  lVar7 = 0;
  do {
    *(undefined8 *)
     ((long)local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar7 + 0x10) = *(undefined8 *)((long)local_108 + lVar7 + 0x10);
    uVar2 = *(undefined8 *)((long)local_108 + lVar7 + 8);
    *(undefined8 *)
     ((long)local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] + lVar7
     ) = *(undefined8 *)((long)local_108 + lVar7);
    *(undefined8 *)
     ((long)local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar7 + 8) = uVar2;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x48);
  Snapshot::setHmat((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.snap,&local_68
                   );
  return;
}

Assistant:

void NPrT::scaleSimBox() {
    Mat3x3d scaleMat;

    scaleMat(axis1_, axis1_) = exp(dt * eta(axis1_, axis1_));
    scaleMat(axis2_, axis2_) = exp(dt * eta(axis2_, axis2_));
    scaleMat(axis_, axis_)   = exp(dt * eta(axis_, axis_));
    Mat3x3d hmat             = snap->getHmat();
    hmat                     = hmat * scaleMat;
    snap->setHmat(hmat);
  }